

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::AppendTarget
          (cmExtraKateGenerator *this,cmGeneratedFileStream *fout,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,string *make,string *makeArgs,string *path,string *homeOutputDir)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  pointer __rhs;
  string *psVar4;
  ulong uVar5;
  allocator<char> local_10a;
  allocator<char> local_109;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108;
  cmExtraKateGenerator *local_100;
  string *local_f8;
  string *local_f0;
  string *local_e8;
  cmGeneratedFileStream *local_e0;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8 = (configs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_108 = configs;
  local_100 = this;
  local_f8 = target;
  local_f0 = makeArgs;
  local_e8 = make;
  local_e0 = fout;
  for (__rhs = (configs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __rhs != local_d8; __rhs = __rhs + 1) {
    poVar3 = std::operator<<((ostream *)local_e0,"\t\t\t");
    cVar1 = ' ';
    if (AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
        ::JsonSep != '\0') {
      cVar1 = ',';
    }
    poVar3 = std::operator<<(poVar3,cVar1);
    poVar3 = std::operator<<(poVar3,"{\"name\":\"");
    poVar3 = std::operator<<(poVar3,(string *)local_f8);
    uVar5 = (long)(local_108->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_108->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < 0x21) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,":",&local_109);
      std::operator+(&local_b0,&local_50,__rhs);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,"\", \"build_cmd\":\"");
    poVar3 = std::operator<<(poVar3,(string *)local_e8);
    poVar3 = std::operator<<(poVar3," -C \\\"");
    psVar4 = path;
    if (local_100->UseNinja != false) {
      psVar4 = homeOutputDir;
    }
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3,"\\\" ");
    if ((local_100->UseNinja == true) &&
       (0x20 < (ulong)((long)(local_108->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_108->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90," -f build-",&local_10a);
      std::operator+(&local_70,&local_90,__rhs);
      bVar2 = true;
      std::operator+(&local_d0,&local_70,".ninja");
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      bVar2 = false;
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_d0);
    poVar3 = std::operator<<(poVar3,(string *)local_f0);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)local_f8);
    std::operator<<(poVar3,"\"}\n");
    std::__cxx11::string::~string((string *)&local_d0);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__cxx11::string::~string((string *)&local_b0);
    if (0x20 < uVar5) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::JsonSep = '\x01';
  }
  return;
}

Assistant:

void cmExtraKateGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& target,
  const std::vector<std::string>& configs, const std::string& make,
  const std::string& makeArgs, const std::string& path,
  const std::string& homeOutputDir) const
{
  static char JsonSep = ' ';

  for (const std::string& conf : configs) {
    fout << "\t\t\t" << JsonSep << R"({"name":")" << target
         << ((configs.size() > 1) ? (std::string(":") + conf) : std::string())
         << "\", "
            "\"build_cmd\":\""
         << make << " -C \\\"" << (this->UseNinja ? homeOutputDir : path)
         << "\\\" "
         << ((this->UseNinja && configs.size() > 1)
               ? std::string(" -f build-") + conf + ".ninja"
               : std::string())
         << makeArgs << " " << target << "\"}\n";

    JsonSep = ',';
  }
}